

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O0

void __thiscall SimpleStrategy::process(SimpleStrategy *this)

{
  CFG *pCVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  Status SVar5;
  iterator __first;
  iterator __last;
  reference ppCVar6;
  Addr AVar7;
  void *pvVar8;
  ostream *poVar9;
  char *pcVar10;
  undefined1 local_258 [8];
  Stats s_1;
  Addr addr_1;
  CFG *cfg_1;
  iterator __end2;
  iterator __begin2;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range2;
  Stats s;
  undefined1 local_1d0 [8];
  Report r;
  _Self local_130;
  iterator it;
  Addr addr;
  CFG *cfg;
  iterator __end1;
  iterator __begin1;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range1;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> bCFGs;
  undefined1 local_90 [8];
  Report total;
  SimpleStrategy *this_local;
  
  total.unmatched.b._32_8_ = this;
  Report::Report((Report *)local_90);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,
                             "file,cfg,instrs,blocks,phantoms,edges,calls");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1,
                      (this->super_Strategy).m_b);
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1,
                      (this->super_Strategy).m_a);
  __end1 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                     ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  cfg = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                         ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&cfg), bVar3) {
    ppCVar6 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end1);
    pCVar1 = *ppCVar6;
    SVar5 = CFG::status(pCVar1);
    if (SVar5 == VALID) {
      it._M_node = (_Base_ptr)CFG::addr(pCVar1);
      bVar3 = Strategy::isAddrInRange(&this->super_Strategy,(Addr)it._M_node);
      if (bVar3) {
        __first = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                            ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
        __last = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                           ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
        local_130._M_node =
             (_Base_ptr)
             std::find_if<std::_Rb_tree_const_iterator<CFG*>,SimpleStrategy::process()::__0>
                       (__first._M_node,__last._M_node,it._M_node);
        r.unmatched.b._32_8_ =
             std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                       ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
        bVar4 = std::operator!=(&local_130,(_Self *)&r.unmatched.b.indirects);
        bVar3 = false;
        if (bVar4) {
          ppCVar6 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&local_130);
          SVar5 = CFG::status(*ppCVar6);
          bVar3 = SVar5 == VALID;
        }
        if (bVar3) {
          ppCVar6 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&local_130);
          compareCFGs((Report *)local_1d0,this,pCVar1,*ppCVar6);
          Stats::operator+=((Stats *)&total,(Stats *)&r);
          Stats::operator+=((Stats *)&total.matched.indirects,(Stats *)&r.matched.indirects);
          Stats::operator+=((Stats *)&total.unmatched.a.indirects,(Stats *)&r.unmatched.a.indirects)
          ;
          if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
            std::ostream::operator<<(&std::cout,std::hex);
            poVar9 = std::operator<<((ostream *)&std::cout,"CFG 0x");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ulong)it._M_node);
            pcVar10 = ": both files";
            if (((this->super_Strategy).m_config.both & 1U) != 0) {
              pcVar10 = "";
            }
            poVar9 = std::operator<<(poVar9,pcVar10);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::dec);
            operator<<((ostream *)&std::cout,(Report *)local_1d0);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          bVar2 = std::ofstream::is_open();
          if ((bVar2 & 1) != 0) {
            poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"both,0x");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,std::hex);
            pvVar8 = (void *)std::ostream::operator<<(pvVar8,(ulong)it._M_node);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.matched._vptr_Stats._4_4_);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.matched.cfgs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.matched.instrs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.matched.blocks);
            poVar9 = std::operator<<(poVar9,",");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,r.matched.phantoms);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"A,0x");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,std::hex);
            pvVar8 = (void *)std::ostream::operator<<(pvVar8,(ulong)it._M_node);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.a._vptr_Stats._4_4_);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.a.cfgs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.a.instrs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.a.blocks);
            poVar9 = std::operator<<(poVar9,",");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,r.unmatched.a.phantoms);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"B,0x");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,std::hex);
            pvVar8 = (void *)std::ostream::operator<<(pvVar8,(ulong)it._M_node);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.b._vptr_Stats._4_4_);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.b.cfgs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.b.instrs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,r.unmatched.b.blocks);
            poVar9 = std::operator<<(poVar9,",");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,r.unmatched.b.phantoms);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          }
          s._32_8_ = std::set<CFG*,std::less<CFG*>,std::allocator<CFG*>>::erase_abi_cxx11_
                               ((set<CFG*,std::less<CFG*>,std::allocator<CFG*>> *)&__range1,
                                (const_iterator)local_130._M_node);
          Report::~Report((Report *)local_1d0);
        }
        else if (((this->super_Strategy).m_config.both & 1U) == 0) {
          extractStats((Stats *)&__range2,this,pCVar1);
          Stats::operator+=((Stats *)&total.matched.indirects,(Stats *)&__range2);
          if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
            std::ostream::operator<<(&std::cout,std::hex);
            poVar9 = std::operator<<((ostream *)&std::cout,"CFG 0x");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ulong)it._M_node);
            poVar9 = std::operator<<(poVar9,": file A");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::dec);
            poVar9 = operator<<((ostream *)&std::cout,(Stats *)&__range2);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          bVar2 = std::ofstream::is_open();
          if ((bVar2 & 1) != 0) {
            poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"A,0x");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,std::hex);
            pvVar8 = (void *)std::ostream::operator<<(pvVar8,(ulong)it._M_node);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s._vptr_Stats._4_4_);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s.cfgs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s.instrs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s.blocks);
            poVar9 = std::operator<<(poVar9,",");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,s.phantoms);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          }
          Stats::~Stats((Stats *)&__range2);
        }
      }
    }
    std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end1);
  }
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
            ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  if (((this->super_Strategy).m_config.both & 1U) == 0) {
    __end2 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                       ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
    cfg_1 = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                             ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&cfg_1), bVar3) {
      ppCVar6 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end2);
      pCVar1 = *ppCVar6;
      SVar5 = CFG::status(pCVar1);
      if (SVar5 == VALID) {
        s_1._32_8_ = CFG::addr(pCVar1);
        bVar3 = Strategy::isAddrInRange(&this->super_Strategy,s_1._32_8_);
        if (bVar3) {
          extractStats((Stats *)local_258,this,pCVar1);
          Stats::operator+=((Stats *)&total.unmatched.a.indirects,(Stats *)local_258);
          if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
            std::ostream::operator<<(&std::cout,std::hex);
            poVar9 = std::operator<<((ostream *)&std::cout,"CFG 0x");
            AVar7 = CFG::addr(pCVar1);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,AVar7);
            poVar9 = std::operator<<(poVar9,": file B");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::dec);
            poVar9 = operator<<((ostream *)&std::cout,(Stats *)local_258);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          bVar2 = std::ofstream::is_open();
          if ((bVar2 & 1) != 0) {
            poVar9 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"B,0x");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,std::hex);
            AVar7 = CFG::addr(pCVar1);
            pvVar8 = (void *)std::ostream::operator<<(pvVar8,AVar7);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s_1._vptr_Stats._4_4_);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s_1.cfgs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s_1.instrs);
            poVar9 = std::operator<<(poVar9,",");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,s_1.blocks);
            poVar9 = std::operator<<(poVar9,",");
            pvVar8 = (void *)std::ostream::operator<<(poVar9,s_1.phantoms);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          }
          Stats::~Stats((Stats *)local_258);
        }
      }
      std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end2);
    }
  }
  if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Total:");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  operator<<((ostream *)&std::cout,(Report *)local_90);
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
            ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__range1);
  Report::~Report((Report *)local_90);
  return;
}

Assistant:

void SimpleStrategy::process() {
	SimpleStrategy::Report total;

	if (m_fout.is_open())
		m_fout << "file,cfg,instrs,blocks,phantoms,edges,calls" << std::endl;

	std::set<CFG*> bCFGs = m_b->cfgs();
	for (CFG* cfg : m_a->cfgs()) {
		if (cfg->status() != CFG::VALID)
			continue;

		Addr addr = cfg->addr();
		if (!this->isAddrInRange(addr))
			continue;

		std::set<CFG*>::iterator it = std::find_if(bCFGs.begin(), bCFGs.end(),
		             [addr](const CFG* tmp) -> bool { return tmp->addr() == addr; });
		if (it != bCFGs.end() && (*it)->status() == CFG::VALID) {
			SimpleStrategy::Report r = compareCFGs(cfg, *it);
			total.matched += r.matched;
			total.unmatched.a += r.unmatched.a;
			total.unmatched.b += r.unmatched.b;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << addr << (!m_config.both ? ": both files" : "") << std::endl;

				std::cout << std::dec;
				std::cout << r;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "both,0x" << std::hex << addr << std::dec
						<< "," << r.matched.instrs << "," << r.matched.blocks
						<< "," << r.matched.phantoms << "," << r.matched.edges
						<< "," << r.matched.calls << std::endl;
				m_fout << "A,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.a.instrs << "," << r.unmatched.a.blocks
						<< "," << r.unmatched.a.phantoms << "," << r.unmatched.a.edges
						<< "," << r.unmatched.a.calls << std::endl;
				m_fout << "B,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.b.instrs << "," << r.unmatched.b.blocks
						<< "," << r.unmatched.b.phantoms << "," << r.unmatched.b.edges
						<< "," << r.unmatched.b.calls << std::endl;
			}

			bCFGs.erase(it);
		} else {
			if (!m_config.both) {
				SimpleStrategy::Stats s = extractStats(cfg);
				total.unmatched.a += s;

				if (m_config.detailed) {
					std::cout << std::hex;
					std::cout << "CFG 0x" << addr << ": file A" << std::endl;

					std::cout << std::dec;
					std::cout << s << std::endl;
					std::cout << std::endl;
				}

				if (m_fout.is_open()) {
					m_fout << "A,0x" << std::hex << addr << std::dec
							<< "," << s.instrs << "," << s.blocks
							<< "," << s.phantoms << "," << s.edges
							<< "," << s.calls << std::endl;
				}
			}
		}
	}

	if (!m_config.both) {
		for (CFG* cfg : bCFGs) {
			if (cfg->status() != CFG::VALID)
				continue;

			Addr addr = cfg->addr();
			if (!this->isAddrInRange(addr))
				continue;

			SimpleStrategy::Stats s = extractStats(cfg);
			total.unmatched.b += s;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << cfg->addr() << ": file B" << std::endl;

				std::cout << std::dec;
				std::cout << s << std::endl;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "B,0x" << std::hex << cfg->addr() << std::dec
						<< "," << s.instrs << "," << s.blocks
						<< "," << s.phantoms << "," << s.edges
						<< "," << s.calls << std::endl;
			}
		}
	}

	if (m_config.detailed)
		std::cout << "Total:" << std::endl;
	std::cout << total;
}